

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

int __thiscall io::posix::file::open(file *this,char *__file,int __oflag,...)

{
  int iVar1;
  undefined8 in_RAX;
  int *piVar2;
  error_category *extraout_RAX;
  error_category *peVar3;
  uint in_ECX;
  error_code *in_R8;
  file_descriptor_handle local_38;
  
  local_38._4_4_ = SUB84((ulong)in_RAX >> 0x20,0);
  std::error_code::clear(in_R8);
  piVar2 = __errno_location();
  *piVar2 = 0;
  local_38.fd_ = ::open(*(char **)__file,__oflag,(ulong)in_ECX);
  if (local_38.fd_ < 0) {
    iVar1 = *piVar2;
    peVar3 = (error_category *)std::_V2::system_category();
    in_R8->_M_value = iVar1;
    in_R8->_M_cat = peVar3;
  }
  else {
    local_38.delete_ = true;
    file_descriptor_handle::operator=(&this->fd_,&local_38);
    file_descriptor_handle::~file_descriptor_handle(&local_38);
    peVar3 = extraout_RAX;
  }
  return (int)peVar3;
}

Assistant:

void open(const io_std::filesystem::path& path,
              int mode, ::mode_t create_perms, std::error_code& ec) noexcept
    {
        ec.clear();
        errno = 0;

        int new_fd = ::open(path.c_str(), mode, create_perms);

        if (new_fd < 0) {
            ec.assign(errno, std::system_category());
            return;
        }

        fd_ = posix::file_descriptor_handle{new_fd};
    }